

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote-control.cpp
# Opt level: O2

int main(void)

{
  size_type sVar1;
  bool bVar2;
  motor *pmVar3;
  allocator local_261;
  _Any_data local_260 [2];
  large_motor rmotor;
  large_motor lmotor;
  address_type local_1f0;
  address_type local_1d0;
  address_type local_1b0;
  touch_sensor ts;
  string local_150;
  string local_130;
  remote_control rc;
  
  std::__cxx11::string::string((string *)&local_1b0,"ev3-ports:outB",(allocator *)&rc);
  ev3dev::large_motor::large_motor(&lmotor,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string((string *)&local_1d0,"ev3-ports:outC",(allocator *)&rc);
  ev3dev::large_motor::large_motor(&rmotor,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  ev3dev::remote_control::remote_control(&rc,1);
  std::__cxx11::string::string((string *)&local_1f0,(string *)ev3dev::INPUT_AUTO_abi_cxx11_);
  ev3dev::touch_sensor::touch_sensor(&ts,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string
            ((string *)local_260[0]._M_pod_data,"Motor on outB is not connected",&local_261);
  precondition(lmotor.super_motor.super_device._path._M_string_length != 0,(string *)local_260);
  std::__cxx11::string::~string((string *)local_260[0]._M_pod_data);
  std::__cxx11::string::string
            ((string *)local_260[0]._M_pod_data,"Motor on outC is not connected",&local_261);
  precondition(rmotor.super_motor.super_device._path._M_string_length != 0,(string *)local_260);
  std::__cxx11::string::~string((string *)local_260[0]._M_pod_data);
  sVar1 = ((rc._sensor)->super_sensor).super_device._path._M_string_length;
  std::__cxx11::string::string
            ((string *)local_260[0]._M_pod_data,"Infrared sensor is not connected",&local_261);
  precondition(sVar1 != 0,(string *)local_260);
  std::__cxx11::string::~string((string *)local_260[0]._M_pod_data);
  std::__cxx11::string::string
            ((string *)local_260[0]._M_pod_data,"Touch sensor is not connected",&local_261);
  precondition(ts.super_sensor.super_device._path._M_string_length != 0,(string *)local_260);
  std::__cxx11::string::~string((string *)local_260[0]._M_pod_data);
  roll<ev3dev::large_motor,std::vector<ev3dev::led*,std::allocator<ev3dev::led*>>>
            ((function<void_(bool)> *)local_260,&lmotor,
             (vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *)ev3dev::led::left,1);
  std::function<void_(bool)>::operator=(&rc.on_red_up,(function<void_(bool)> *)local_260);
  std::_Function_base::~_Function_base((_Function_base *)local_260);
  roll<ev3dev::large_motor,std::vector<ev3dev::led*,std::allocator<ev3dev::led*>>>
            ((function<void_(bool)> *)local_260,&lmotor,
             (vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *)ev3dev::led::left,-1);
  std::function<void_(bool)>::operator=(&rc.on_red_down,(function<void_(bool)> *)local_260);
  std::_Function_base::~_Function_base((_Function_base *)local_260);
  roll<ev3dev::large_motor,std::vector<ev3dev::led*,std::allocator<ev3dev::led*>>>
            ((function<void_(bool)> *)local_260,&rmotor,
             (vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *)ev3dev::led::right,1);
  std::function<void_(bool)>::operator=(&rc.on_blue_up,(function<void_(bool)> *)local_260);
  std::_Function_base::~_Function_base((_Function_base *)local_260);
  roll<ev3dev::large_motor,std::vector<ev3dev::led*,std::allocator<ev3dev::led*>>>
            ((function<void_(bool)> *)local_260,&rmotor,
             (vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *)ev3dev::led::right,-1);
  std::function<void_(bool)>::operator=(&rc.on_blue_down,(function<void_(bool)> *)local_260);
  std::_Function_base::~_Function_base((_Function_base *)local_260);
  while( true ) {
    bVar2 = ev3dev::button::pressed((button *)ev3dev::button::enter);
    if (bVar2) break;
    ev3dev::remote_control::process(&rc);
    bVar2 = ev3dev::touch_sensor::is_pressed(&ts,true);
    if (bVar2) {
      std::__cxx11::string::string((string *)local_260[0]._M_pod_data,"Oops, excuse me!",&local_261)
      ;
      ev3dev::sound::speak((string *)local_260,false);
      std::__cxx11::string::~string((string *)local_260[0]._M_pod_data);
      std::__cxx11::string::string
                ((string *)&local_130,"brake",(allocator *)local_260[0]._M_pod_data);
      pmVar3 = ev3dev::motor::set_stop_action(&lmotor.super_motor,&local_130);
      ev3dev::motor::stop(pmVar3);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::string
                ((string *)&local_150,"brake",(allocator *)local_260[0]._M_pod_data);
      pmVar3 = ev3dev::motor::set_stop_action(&rmotor.super_motor,&local_150);
      ev3dev::motor::stop(pmVar3);
      std::__cxx11::string::~string((string *)&local_150);
      ev3dev::led::set_color
                ((vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *)ev3dev::led::left,
                 (vector<float,_std::allocator<float>_> *)ev3dev::led::red);
      ev3dev::led::set_color
                ((vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *)ev3dev::led::right,
                 (vector<float,_std::allocator<float>_> *)ev3dev::led::red);
      pmVar3 = ev3dev::motor::set_time_sp(&lmotor.super_motor,500);
      pmVar3 = ev3dev::motor::set_speed_sp(pmVar3,-900);
      ev3dev::motor::run_timed(pmVar3);
      pmVar3 = ev3dev::motor::set_time_sp(&rmotor.super_motor,500);
      pmVar3 = ev3dev::motor::set_speed_sp(pmVar3,-900);
      ev3dev::motor::run_timed(pmVar3);
      local_260[0]._M_unused._M_member_pointer = 500;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)local_260);
      ev3dev::led::all_off();
    }
    local_260[0]._M_unused._M_member_pointer = (void *)0xa;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)local_260);
  }
  ev3dev::sensor::~sensor(&ts.super_sensor);
  ev3dev::remote_control::~remote_control(&rc);
  std::__cxx11::string::~string((string *)&rmotor);
  std::__cxx11::string::~string((string *)&lmotor);
  return 0;
}

Assistant:

int main() {
    ev3::large_motor lmotor(ev3::OUTPUT_B);
    ev3::large_motor rmotor(ev3::OUTPUT_C);
    ev3::remote_control rc;
    ev3::touch_sensor   ts;

    precondition(lmotor.connected(), "Motor on outB is not connected");
    precondition(rmotor.connected(), "Motor on outC is not connected");
    precondition(rc.connected(),     "Infrared sensor is not connected");
    precondition(ts.connected(),     "Touch sensor is not connected");

    rc.on_red_up    = roll(lmotor, ev3::led::left,   1);
    rc.on_red_down  = roll(lmotor, ev3::led::left,  -1);
    rc.on_blue_up   = roll(rmotor, ev3::led::right,  1);
    rc.on_blue_down = roll(rmotor, ev3::led::right, -1);

    // Enter event processing loop
    while (!ev3::button::enter.pressed()) {
        rc.process();

        // Backup when an obstacle is bumped
        if (ts.is_pressed()) {
            ev3::sound::speak("Oops, excuse me!");

            lmotor.set_stop_action("brake").stop();
            rmotor.set_stop_action("brake").stop();

            // Turn red lights on
            ev3::led::set_color(ev3::led::left,  ev3::led::red);
            ev3::led::set_color(ev3::led::right, ev3::led::red);

            // Run both motors backwards for 0.5 seconds
            lmotor.set_time_sp(500).set_speed_sp(-900).run_timed();
            rmotor.set_time_sp(500).set_speed_sp(-900).run_timed();

            // Wait 0.5 seconds while motors are rolling
            std::this_thread::sleep_for(std::chrono::milliseconds(500));

            ev3::led::all_off();
        }

        std::this_thread::sleep_for(std::chrono::milliseconds(10));
    }
}